

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int acttab_insert(acttab *p)

{
  int *piVar1;
  int iVar2;
  lookahead_action *plVar3;
  int iVar4;
  uint uVar5;
  lookahead_action *plVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  if (p->nLookahead < 1) {
    __assert_fail("p->nLookahead>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                  ,0x231,"int acttab_insert(acttab *)");
  }
  uVar5 = p->nAction;
  iVar12 = p->nActionAlloc;
  iVar8 = p->mxLookahead + uVar5 + 1;
  iVar4 = iVar12;
  if (iVar12 <= iVar8) {
    iVar4 = iVar12 + iVar8 + 0x14;
    p->nActionAlloc = iVar4;
    plVar6 = (lookahead_action *)realloc(p->aAction,(long)iVar4 << 3);
    p->aAction = plVar6;
    if (plVar6 == (lookahead_action *)0x0) {
      fwrite("malloc failed\n",0xe,1,_stderr);
      exit(1);
    }
    iVar4 = p->nActionAlloc;
    for (lVar9 = (long)iVar12; lVar9 < iVar4; lVar9 = lVar9 + 1) {
      plVar6[lVar9].lookahead = -1;
      plVar6[lVar9].action = -1;
    }
    uVar5 = p->nAction;
  }
  uVar10 = 0;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar5;
  }
  uVar7 = (ulong)uVar5;
  iVar12 = -uVar5;
LAB_001035c2:
  do {
    iVar12 = iVar12 + 1;
    if ((int)uVar7 < 1) {
      uVar16 = iVar4 - p->mxLookahead;
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      iVar12 = 0;
      uVar13 = 0;
      break;
    }
    uVar7 = uVar7 - 1;
    plVar6 = p->aAction;
    iVar8 = plVar6[uVar7 & 0xffffffff].lookahead;
    if ((iVar8 == p->mnLookahead) && (plVar6[uVar7 & 0xffffffff].action == p->mnAction)) {
      uVar16 = p->nLookahead;
      uVar13 = 0;
      if (0 < (int)uVar16) {
        uVar13 = (ulong)uVar16;
      }
      uVar14 = 0;
      while (uVar13 != uVar14) {
        iVar2 = p->aLookahead[uVar14].lookahead;
        uVar15 = (iVar2 - iVar8) + (int)uVar7;
        if (((((int)uVar15 < 0) || ((int)uVar5 <= (int)uVar15)) ||
            (iVar2 != plVar6[uVar15].lookahead)) ||
           (plVar3 = p->aLookahead + uVar14, uVar14 = uVar14 + 1,
           plVar3->action != plVar6[uVar15].action)) goto LAB_001035c2;
      }
      uVar15 = 0;
      for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
        uVar15 = uVar15 + (iVar8 + iVar12 + (int)uVar13 == plVar6[uVar13].lookahead &&
                          -1 < plVar6[uVar13].lookahead);
      }
      if (uVar15 == uVar16) goto LAB_0010371d;
    }
  } while( true );
LAB_0010369a:
  uVar7 = (ulong)uVar16;
  if (uVar13 != uVar16) {
    plVar6 = p->aAction;
    if (plVar6[uVar13].lookahead < 0) {
      uVar15 = p->nLookahead;
      if (p->nLookahead < 1) {
        uVar15 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar15 == uVar7) {
          lVar9 = 0;
          uVar15 = 0xffffffff;
          goto LAB_001036e9;
        }
        uVar11 = (p->aLookahead[uVar7].lookahead - p->mnLookahead) + (int)uVar13;
      } while ((-1 < (int)uVar11) && (uVar7 = uVar7 + 1, plVar6[uVar11].lookahead < 0));
    }
    goto LAB_001036aa;
  }
  goto LAB_0010371d;
  while( true ) {
    uVar11 = uVar15 + 1;
    iVar4 = p->mnLookahead + iVar12 + uVar15;
    piVar1 = (int *)((long)&plVar6->lookahead + lVar9);
    lVar9 = lVar9 + 8;
    uVar15 = uVar11;
    if (iVar4 + 1 == *piVar1) break;
LAB_001036e9:
    uVar11 = (uint)uVar10;
    if (uVar10 << 3 == lVar9) break;
  }
  uVar7 = uVar13;
  if (uVar11 == uVar5) goto LAB_0010371d;
LAB_001036aa:
  uVar13 = uVar13 + 1;
  iVar12 = iVar12 + -1;
  goto LAB_0010369a;
LAB_0010371d:
  for (lVar9 = 0; lVar9 < p->nLookahead; lVar9 = lVar9 + 1) {
    iVar12 = (p->aLookahead[lVar9].lookahead - p->mnLookahead) + (int)uVar7;
    p->aAction[iVar12] = p->aLookahead[lVar9];
    if (p->nAction <= iVar12) {
      p->nAction = iVar12 + 1;
    }
  }
  p->nLookahead = 0;
  return (int)uVar7 - p->mnLookahead;
}

Assistant:

int acttab_insert(acttab *p){
  int i, j, k, n;
  assert( p->nLookahead>0 );

  /* Make sure we have enough space to hold the expanded action table
  ** in the worst case.  The worst case occurs if the transaction set
  ** must be appended to the current action table
  */
  n = p->mxLookahead + 1;
  if( p->nAction + n >= p->nActionAlloc ){
    int oldAlloc = p->nActionAlloc;
    p->nActionAlloc = p->nAction + n + p->nActionAlloc + 20;
    p->aAction = (struct lookahead_action *) realloc( p->aAction,
                          sizeof(p->aAction[0])*p->nActionAlloc);
    if( p->aAction==0 ){
      fprintf(stderr,"malloc failed\n");
      exit(1);
    }
    for(i=oldAlloc; i<p->nActionAlloc; i++){
      p->aAction[i].lookahead = -1;
      p->aAction[i].action = -1;
    }
  }

  /* Scan the existing action table looking for an offset that is a 
  ** duplicate of the current transaction set.  Fall out of the loop
  ** if and when the duplicate is found.
  **
  ** i is the index in p->aAction[] where p->mnLookahead is inserted.
  */
  for(i=p->nAction-1; i>=0; i--){
    if( p->aAction[i].lookahead==p->mnLookahead ){
      /* All lookaheads and actions in the aLookahead[] transaction
      ** must match against the candidate aAction[i] entry. */
      if( p->aAction[i].action!=p->mnAction ) continue;
      for(j=0; j<p->nLookahead; j++){
        k = p->aLookahead[j].lookahead - p->mnLookahead + i;
        if( k<0 || k>=p->nAction ) break;
        if( p->aLookahead[j].lookahead!=p->aAction[k].lookahead ) break;
        if( p->aLookahead[j].action!=p->aAction[k].action ) break;
      }
      if( j<p->nLookahead ) continue;

      /* No possible lookahead value that is not in the aLookahead[]
      ** transaction is allowed to match aAction[i] */
      n = 0;
      for(j=0; j<p->nAction; j++){
        if( p->aAction[j].lookahead<0 ) continue;
        if( p->aAction[j].lookahead==j+p->mnLookahead-i ) n++;
      }
      if( n==p->nLookahead ){
        break;  /* An exact match is found at offset i */
      }
    }
  }

  /* If no existing offsets exactly match the current transaction, find an
  ** an empty offset in the aAction[] table in which we can add the
  ** aLookahead[] transaction.
  */
  if( i<0 ){
    /* Look for holes in the aAction[] table that fit the current
    ** aLookahead[] transaction.  Leave i set to the offset of the hole.
    ** If no holes are found, i is left at p->nAction, which means the
    ** transaction will be appended. */
    for(i=0; i<p->nActionAlloc - p->mxLookahead; i++){
      if( p->aAction[i].lookahead<0 ){
        for(j=0; j<p->nLookahead; j++){
          k = p->aLookahead[j].lookahead - p->mnLookahead + i;
          if( k<0 ) break;
          if( p->aAction[k].lookahead>=0 ) break;
        }
        if( j<p->nLookahead ) continue;
        for(j=0; j<p->nAction; j++){
          if( p->aAction[j].lookahead==j+p->mnLookahead-i ) break;
        }
        if( j==p->nAction ){
          break;  /* Fits in empty slots */
        }
      }
    }
  }
  /* Insert transaction set at index i. */
  for(j=0; j<p->nLookahead; j++){
    k = p->aLookahead[j].lookahead - p->mnLookahead + i;
    p->aAction[k] = p->aLookahead[j];
    if( k>=p->nAction ) p->nAction = k+1;
  }
  p->nLookahead = 0;

  /* Return the offset that is added to the lookahead in order to get the
  ** index into yy_action of the action */
  return i - p->mnLookahead;
}